

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

int __thiscall
FStateDefinitions::FinishStates(FStateDefinitions *this,PClassActor *actor,AActor *defaults)

{
  uint uVar1;
  FState *firststate;
  FState *pFVar2;
  long lVar3;
  AActor *actor_00;
  FState *pFVar4;
  long lVar5;
  
  uVar1 = (this->StateArray).Count;
  lVar3 = (long)(int)uVar1;
  if (lVar3 < 1) {
    ResolveGotoLabels(this,actor,defaults,&this->StateLabels);
  }
  else {
    firststate = (FState *)operator_new__(lVar3 * 0x28);
    memcpy(firststate,(this->StateArray).Array,lVar3 * 0x28);
    actor->OwnedStates = firststate;
    actor->NumOwnedStates = uVar1;
    SaveStateSourceLines(firststate,&this->SourceLines);
    FixStatePointers(actor,&this->StateLabels);
    actor_00 = (AActor *)actor;
    ResolveGotoLabels(this,actor,defaults,&this->StateLabels);
    lVar5 = 0;
    pFVar4 = firststate;
    do {
      switch(pFVar4->DefineFlags) {
      case '\0':
        pFVar2 = pFVar4 + 1;
        if (lVar3 + -1 <= lVar5) {
          pFVar2 = firststate;
        }
        break;
      default:
        goto switchD_00457235_caseD_1;
      case '\x02':
        pFVar2 = (FState *)0x0;
        break;
      case '\x03':
        pFVar2 = pFVar4;
        break;
      case '\x04':
        pFVar2 = ResolveGotoLabel(this,actor_00,actor,(char *)pFVar4->NextState);
        break;
      case '\x05':
        pFVar2 = firststate + (long)((long)&pFVar4->NextState[-1].Misc2 + 3);
      }
      pFVar4->NextState = pFVar2;
switchD_00457235_caseD_1:
      lVar5 = lVar5 + 1;
      pFVar4 = pFVar4 + 1;
    } while (lVar3 != lVar5);
  }
  return uVar1;
}

Assistant:

int FStateDefinitions::FinishStates(PClassActor *actor, AActor *defaults)
{
	int count = StateArray.Size();

	if (count > 0)
	{
		FState *realstates = new FState[count];
		int i;

		memcpy(realstates, &StateArray[0], count*sizeof(FState));
		actor->OwnedStates = realstates;
		actor->NumOwnedStates = count;
		SaveStateSourceLines(realstates, SourceLines);

		// adjust the state pointers
		// In the case new states are added these must be adjusted, too!
		FixStatePointers(actor, StateLabels);

		// Fix state pointers that are gotos
		ResolveGotoLabels(actor, defaults, StateLabels);

		for (i = 0; i < count; i++)
		{
			// resolve labels and jumps
			switch (realstates[i].DefineFlags)
			{
			case SDF_STOP:		// stop
				realstates[i].NextState = NULL;
				break;

			case SDF_WAIT:		// wait
				realstates[i].NextState = &realstates[i];
				break;

			case SDF_NEXT:		// next
				realstates[i].NextState = (i < count-1 ? &realstates[i+1] : &realstates[0]);
				break;

			case SDF_INDEX:		// loop
				realstates[i].NextState = &realstates[(size_t)realstates[i].NextState-1];
				break;

			case SDF_LABEL:
				realstates[i].NextState = ResolveGotoLabel(defaults, actor, (char *)realstates[i].NextState);
				break;
			}
		}
	}
	else
	{
		// Fix state pointers that are gotos
		ResolveGotoLabels(actor, defaults, StateLabels);
	}
	return count;
}